

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceGroupCommand.cxx
# Opt level: O2

bool __thiscall
cmSourceGroupCommand::InitialPass
          (cmSourceGroupCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  cmMakefile *pcVar1;
  pointer pbVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  char *pcVar6;
  cmSourceGroup *this_00;
  ostream *poVar7;
  string *this_01;
  uint uVar8;
  ulong uVar9;
  string local_200;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  folders;
  string delimiter;
  string error;
  
  __lhs = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  if (__lhs == (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string
              ((string *)&error,"called with incorrect number of arguments",(allocator *)&delimiter)
    ;
    cmCommand::SetError(&this->super_cmCommand,&error);
    std::__cxx11::string::~string((string *)&error);
    return false;
  }
  bVar3 = std::operator==(__lhs,"TREE");
  if (bVar3) {
    error._M_dataplus._M_p = (pointer)&error.field_2;
    error._M_string_length = 0;
    error.field_2._M_local_buf[0] = '\0';
    bVar3 = processTree(this,args,&error);
    if (!bVar3) {
      cmCommand::SetError(&this->super_cmCommand,&error);
    }
    this_01 = &error;
    goto LAB_0032ecad;
  }
  std::__cxx11::string::string((string *)&delimiter,"\\",(allocator *)&error);
  pcVar1 = (this->super_cmCommand).Makefile;
  std::__cxx11::string::string((string *)&error,"SOURCE_GROUP_DELIMITER",(allocator *)&local_200);
  pcVar6 = cmMakefile::GetDefinition(pcVar1,&error);
  std::__cxx11::string::~string((string *)&error);
  if (pcVar6 != (char *)0x0) {
    pcVar1 = (this->super_cmCommand).Makefile;
    std::__cxx11::string::string((string *)&error,"SOURCE_GROUP_DELIMITER",(allocator *)&local_200);
    cmMakefile::GetDefinition(pcVar1,&error);
    std::__cxx11::string::assign((char *)&delimiter);
    std::__cxx11::string::~string((string *)&error);
  }
  cmSystemTools::tokenize
            (&folders,(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start,&delimiter);
  this_00 = cmMakefile::GetSourceGroup((this->super_cmCommand).Makefile,&folders);
  if (this_00 == (cmSourceGroup *)0x0) {
    cmMakefile::AddSourceGroup((this->super_cmCommand).Makefile,&folders,(char *)0x0);
    this_00 = cmMakefile::GetSourceGroup((this->super_cmCommand).Makefile,&folders);
    if (this_00 != (cmSourceGroup *)0x0) goto LAB_0032ea50;
    std::__cxx11::string::string
              ((string *)&error,"Could not create or find source group",(allocator *)&local_200);
    cmCommand::SetError(&this->super_cmCommand,&error);
LAB_0032ec14:
    std::__cxx11::string::~string((string *)&error);
LAB_0032ec9c:
    bVar3 = false;
  }
  else {
LAB_0032ea50:
    pbVar2 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (((long)(args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 == 0x40) &&
       (bVar3 = std::operator!=(pbVar2 + 1,"FILES"), bVar3)) {
      bVar3 = true;
      cmSourceGroup::SetGroupRegex
                (this_00,(args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
    }
    else {
      uVar8 = 1;
      bVar3 = false;
      while( true ) {
        uVar9 = (ulong)uVar8;
        pbVar2 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) <= uVar9)
        break;
        bVar4 = std::operator==(pbVar2 + uVar9,"REGULAR_EXPRESSION");
        if (bVar4) {
          uVar8 = uVar8 + 1;
          pbVar2 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) <=
              (ulong)uVar8) {
            std::__cxx11::string::string
                      ((string *)&error,"REGULAR_EXPRESSION argument given without a regex.",
                       (allocator *)&local_200);
            cmCommand::SetError(&this->super_cmCommand,&error);
            goto LAB_0032ec14;
          }
          cmSourceGroup::SetGroupRegex(this_00,pbVar2[uVar8]._M_dataplus._M_p);
        }
        else {
          bVar5 = std::operator==((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar9,"FILES");
          if (!bVar5) {
            if (!bVar3) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&error);
              poVar7 = std::operator<<((ostream *)&error,"Unknown argument \"");
              poVar7 = std::operator<<(poVar7,(string *)
                                              ((args->
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               )._M_impl.super__Vector_impl_data._M_start + uVar9));
              poVar7 = std::operator<<(poVar7,"\".  ");
              std::operator<<(poVar7,"Perhaps the FILES keyword is missing.\n");
              std::__cxx11::stringbuf::str();
              cmCommand::SetError(&this->super_cmCommand,&local_200);
              std::__cxx11::string::~string((string *)&local_200);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error);
              goto LAB_0032ec9c;
            }
            std::__cxx11::string::string
                      ((string *)&error,
                       (string *)
                       ((args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + uVar9));
            bVar3 = cmsys::SystemTools::FileIsFullPath(error._M_dataplus._M_p);
            if (!bVar3) {
              cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
              std::__cxx11::string::assign((char *)&error);
              std::__cxx11::string::append((char *)&error);
              std::__cxx11::string::append((string *)&error);
            }
            cmsys::SystemTools::CollapseFullPath(&local_200,&error);
            std::__cxx11::string::operator=((string *)&error,(string *)&local_200);
            std::__cxx11::string::~string((string *)&local_200);
            cmSourceGroup::AddGroupFile(this_00,&error);
            std::__cxx11::string::~string((string *)&error);
          }
        }
        bVar3 = !bVar4;
        uVar8 = uVar8 + 1;
      }
      bVar3 = true;
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&folders);
  this_01 = &delimiter;
LAB_0032ecad:
  std::__cxx11::string::~string((string *)this_01);
  return bVar3;
}

Assistant:

bool cmSourceGroupCommand::InitialPass(std::vector<std::string> const& args,
                                       cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  if (args[0] == "TREE") {
    std::string error;

    if (!processTree(args, error)) {
      this->SetError(error);
      return false;
    }

    return true;
  }

  std::string delimiter = "\\";
  if (this->Makefile->GetDefinition("SOURCE_GROUP_DELIMITER")) {
    delimiter = this->Makefile->GetDefinition("SOURCE_GROUP_DELIMITER");
  }

  std::vector<std::string> folders =
    cmSystemTools::tokenize(args[0], delimiter);

  cmSourceGroup* sg = CM_NULLPTR;
  sg = this->Makefile->GetSourceGroup(folders);
  if (!sg) {
    this->Makefile->AddSourceGroup(folders);
    sg = this->Makefile->GetSourceGroup(folders);
  }

  if (!sg) {
    this->SetError("Could not create or find source group");
    return false;
  }
  // If only two arguments are given, the pre-1.8 version of the
  // command is being invoked.
  if (args.size() == 2 && args[1] != "FILES") {
    sg->SetGroupRegex(args[1].c_str());
    return true;
  }

  // Process arguments.
  bool doingFiles = false;
  for (unsigned int i = 1; i < args.size(); ++i) {
    if (args[i] == "REGULAR_EXPRESSION") {
      // Next argument must specify the regex.
      if (i + 1 < args.size()) {
        ++i;
        sg->SetGroupRegex(args[i].c_str());
      } else {
        this->SetError("REGULAR_EXPRESSION argument given without a regex.");
        return false;
      }
      doingFiles = false;
    } else if (args[i] == "FILES") {
      // Next arguments will specify files.
      doingFiles = true;
    } else if (doingFiles) {
      // Convert name to full path and add to the group's list.
      std::string src = args[i];
      if (!cmSystemTools::FileIsFullPath(src.c_str())) {
        src = this->Makefile->GetCurrentSourceDirectory();
        src += "/";
        src += args[i];
      }
      src = cmSystemTools::CollapseFullPath(src);
      sg->AddGroupFile(src);
    } else {
      std::ostringstream err;
      err << "Unknown argument \"" << args[i] << "\".  "
          << "Perhaps the FILES keyword is missing.\n";
      this->SetError(err.str());
      return false;
    }
  }

  return true;
}